

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMonthsBinaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (WidthConvertibleToMonthsBinaryOperator *this,interval_t bucket_width,timestamp_t ts)

{
  bool bVar1;
  int32_t ts_months;
  date_t input;
  timestamp_t tVar2;
  
  tVar2.value = bucket_width.micros;
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(tVar2);
  if (bVar1) {
    ts_months = EpochMonths<duckdb::timestamp_t>(tVar2);
    input = WidthConvertibleToMonthsCommon((int32_t)this,ts_months,0x168);
    tVar2 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
    return (timestamp_t)tVar2.value;
  }
  tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(tVar2);
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS));
		}